

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::RegisterParameterizedTests(UnitTestImpl *this)

{
  long in_RDI;
  ParameterizedTestCaseRegistry *unaff_retaddr;
  
  if ((*(byte *)(in_RDI + 0x100) & 1) == 0) {
    ParameterizedTestCaseRegistry::RegisterTests(unaff_retaddr);
    *(undefined1 *)(in_RDI + 0x100) = 1;
  }
  return;
}

Assistant:

void UnitTestImpl::RegisterParameterizedTests() {
  if (!parameterized_tests_registered_) {
    parameterized_test_registry_.RegisterTests();
    parameterized_tests_registered_ = true;
  }
}